

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::
     seq_<jsonip::parser::char_<(char)47>,jsonip::parser::char_<(char)42>,jsonip::parser::apply_until_<jsonip::parser::or_<jsonip::parser::new_line,jsonip::parser::notchar_<(char)10>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::grammar::ccomment_end>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  undefined1 local_12;
  bool var;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::push_state(state);
  bVar1 = char_<(char)47>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state);
  local_12 = false;
  if (bVar1) {
    bVar1 = char_<(char)42>::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
    ;
    local_12 = false;
    if (bVar1) {
      bVar1 = apply_until_<jsonip::parser::or_<jsonip::parser::new_line,jsonip::parser::notchar_<(char)10>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>,jsonip::grammar::ccomment_end>
              ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state);
      local_12 = false;
      if (bVar1) {
        bVar1 = identity<true>::
                match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                          (state);
        local_12 = false;
        if (bVar1) {
          bVar1 = identity<true>::
                  match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                            (state);
          local_12 = false;
          if (bVar1) {
            bVar1 = identity<true>::
                    match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                              (state);
            local_12 = false;
            if (bVar1) {
              bVar1 = identity<true>::
                      match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                (state);
              local_12 = false;
              if (bVar1) {
                local_12 = identity<true>::
                           match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                     (state);
              }
            }
          }
        }
      }
    }
  }
  if (local_12 == false) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::rollback(state);
  }
  else {
    ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::commit(state);
  }
  return local_12;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }